

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TaiwanCalendar::handleGetLimit
          (TaiwanCalendar *this,UCalendarDateFields field,ELimitType limitType)

{
  if (field == UCAL_ERA) {
    return (int32_t)(UCAL_LIMIT_GREATEST_MINIMUM < limitType);
  }
  return kGregorianCalendarLimits[field][limitType];
}

Assistant:

int32_t TaiwanCalendar::handleGetLimit(UCalendarDateFields field, ELimitType limitType) const
{
    if(field == UCAL_ERA) {
        if(limitType == UCAL_LIMIT_MINIMUM || limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
            return BEFORE_MINGUO;
        } else {
            return MINGUO;
        }
    } else {
        return GregorianCalendar::handleGetLimit(field,limitType);
    }
}